

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lock_pthreads.c
# Opt level: O3

LOCK_HANDLE Lock_Init(void)

{
  int iVar1;
  pthread_mutex_t *__mutex;
  LOGGER_LOG p_Var2;
  
  __mutex = (pthread_mutex_t *)malloc(0x28);
  if (__mutex == (pthread_mutex_t *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/adapters/lock_pthreads.c"
                ,"Lock_Init",0xf,1,"malloc failed.");
      return (LOCK_HANDLE)0x0;
    }
  }
  else {
    iVar1 = pthread_mutex_init(__mutex,(pthread_mutexattr_t *)0x0);
    if (iVar1 == 0) {
      return __mutex;
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/adapters/lock_pthreads.c"
                ,"Lock_Init",0x16,1,"pthread_mutex_init failed.");
    }
    free(__mutex);
  }
  return (LOCK_HANDLE)0x0;
}

Assistant:

LOCK_HANDLE Lock_Init(void)
{
    /* Codes_SRS_LOCK_10_002: [Lock_Init on success shall return a valid lock handle which should be a non NULL value] */
    pthread_mutex_t* result = (pthread_mutex_t*)malloc(sizeof(pthread_mutex_t));
    if (result == NULL)
    {
        LogError("malloc failed.");
    }
    else
    {
        if (pthread_mutex_init(result, NULL) != 0)
        {
            /* Codes_SRS_LOCK_10_003: [Lock_Init on error shall return NULL ] */
            LogError("pthread_mutex_init failed.");
            free(result);
            result = NULL;
        }
    }

    return (LOCK_HANDLE)result;
}